

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O3

ssize_t __thiscall
drace::detector::Fasttrack<std::shared_mutex>::read
          (Fasttrack<std::shared_mutex> *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t *puVar1;
  __int_type _Var2;
  VC_ID id;
  bool bVar3;
  VC_ID VVar4;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  undefined4 in_register_00000034;
  ThreadState *t;
  TID tid;
  
  t = (ThreadState *)CONCAT44(in_register_00000034,__fd);
  _Var2 = (t->id).super___atomic_base<unsigned_long>._M_i;
  if (_Var2 == *(__int_type *)((long)__buf + 0x10)) {
    if (this->log_flag == true) {
      (this->log_count).read_ex_same_epoch = (this->log_count).read_ex_same_epoch + 1;
    }
    return _Var2;
  }
  id = (t->id).super___atomic_base<unsigned_long>._M_i;
  tid = (TID)((t->id).super___atomic_base<unsigned_long>._M_i >> 0x20);
  if ((*__buf != 0) && (VVar4 = VarState::get_vc_by_thr((VarState *)__buf,tid), VVar4 == id)) {
    if (this->log_flag != true) {
      return VVar4;
    }
    puVar1 = &(this->log_count).read_sh_same_epoch;
    *puVar1 = *puVar1 + 1;
    return VVar4;
  }
  bVar3 = VarState::is_wr_race((VarState *)__buf,t);
  if (bVar3) {
    report_race_locked(this,(uint32_t)((ulong)*(undefined8 *)((long)__buf + 8) >> 0x20),tid,true,
                       false,(VarState *)__buf,__nbytes);
  }
  if (*__buf == 0) {
    if ((*(long *)((long)__buf + 0x10) != 0) &&
       ((TID)((ulong)*(undefined8 *)((long)__buf + 0x10) >> 0x20) != tid)) {
      if (this->log_flag == true) {
        puVar1 = &(this->log_count).read_share;
        *puVar1 = *puVar1 + 1;
      }
      VarState::set_read_shared((VarState *)__buf,id);
      return extraout_RAX_00;
    }
    if (this->log_flag == true) {
      puVar1 = &(this->log_count).read_exclusive;
      *puVar1 = *puVar1 + 1;
    }
  }
  else if (this->log_flag == true) {
    puVar1 = &(this->log_count).read_shared;
    *puVar1 = *puVar1 + 1;
  }
  VarState::update((VarState *)__buf,false,id);
  return extraout_RAX;
}

Assistant:

void read(ThreadState* t, VarState* v, size_t addr) {
    if (t->return_own_id() ==
        v->get_read_id()) {  // read same epoch, same thread;
      if (log_flag) {
        log_count.read_ex_same_epoch++;
      }
      return;
    }

    size_t id = t->return_own_id();
    uint32_t tid = t->get_tid();

    if (v->is_read_shared() &&
        v->get_vc_by_thr(tid) == id) {  // read shared same epoch
      if (log_flag) {
        log_count.read_sh_same_epoch++;
      }
      return;
    }

    if (v->is_wr_race(t)) {  // write-read race
      report_race_locked(v->get_w_tid(), tid, true, false, *v, addr);
    }

    // update vc
    if (!v->is_read_shared()) {
      if (v->get_read_id() == VarState::VAR_NOT_INIT ||
          (v->get_r_tid() ==
           tid))  // read exclusive->read of same thread but newer epoch
      {
        if (log_flag) {
          log_count.read_exclusive++;
        }
        v->update(false, id);
      } else {  // read gets shared
        if (log_flag) {
          log_count.read_share++;
        }
        v->set_read_shared(id);
      }
    } else {  // read shared
      if (log_flag) {
        log_count.read_shared++;
      }
      v->update(false, id);
    }
  }